

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

CURLcode smb_send_and_recv(connectdata *conn,void **msg)

{
  size_t *psVar1;
  int *piVar2;
  size_t sVar3;
  Curl_easy *pCVar4;
  curl_slist *pcVar5;
  uint uVar6;
  unsigned_short uVar7;
  CURLcode CVar8;
  CURLcode CVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  size_t sVar13;
  size_t nread;
  
  sVar13 = (conn->proto).ftpc.pp.response.tv_sec;
  CVar9 = CURLE_AGAIN;
  if (sVar13 == 0) {
    uVar10 = (conn->proto).smbc.upload_size;
    if (uVar10 == 0) goto LAB_003fcfa8;
    pCVar4 = conn->data;
    nread = (pCVar4->set).upload_buffer_size;
    if (uVar10 < nread) {
      nread = uVar10;
    }
    (pCVar4->req).upload_fromhere = (pCVar4->state).ulbuf;
    CVar8 = Curl_fillreadbuffer(conn,nread,&nread);
    if ((CVar8 != CURLE_AGAIN) && (CVar8 != CURLE_OK)) {
      return CVar8;
    }
    if (nread == 0) {
      return CURLE_OK;
    }
    psVar1 = &(conn->proto).ftpc.pp.sendsize;
    *psVar1 = *psVar1 - nread;
    (conn->proto).smbc.send_size = nread;
    *(undefined8 *)&(conn->proto).ftpc.pp.response.tv_usec = 0;
    sVar13 = nread;
  }
  sVar3 = (conn->proto).smbc.sent;
  sVar13 = sVar13 - sVar3;
  CVar8 = Curl_write(conn,0,(conn->data->state).ulbuf + sVar3,sVar13,(ssize_t *)&nread);
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
  if (nread == sVar13) {
    (conn->proto).ftpc.pp.response.tv_sec = 0;
  }
  else {
    piVar2 = &(conn->proto).ftpc.pp.response.tv_usec;
    *(size_t *)piVar2 = *(long *)piVar2 + nread;
    if ((conn->proto).ftpc.pp.response.tv_sec != 0) {
      return CURLE_AGAIN;
    }
  }
LAB_003fcfa8:
  if ((conn->proto).ftpc.pp.sendsize == 0) {
    pcVar5 = (conn->proto).sshc.quote_item;
    sVar13 = (conn->proto).smbc.got;
    CVar9 = Curl_read(conn,0,(char *)((long)&pcVar5->data + sVar13),0x9000 - sVar13,
                      (ssize_t *)&nread);
    if (CVar9 == CURLE_OK) {
      if ((nread != 0) &&
         (uVar10 = nread + (conn->proto).ftpc.pp.response_time,
         (conn->proto).ftpc.pp.response_time = uVar10, 3 < uVar10)) {
        uVar7 = Curl_read16_be((uchar *)((long)&pcVar5->data + 2));
        if ((ulong)uVar7 + 4 <= (ulong)(conn->proto).ftpc.pp.response_time) {
          if (0x20 < uVar7) {
            uVar6 = (uint)*(byte *)((long)&pcVar5[2].data + 4) * 2;
            uVar12 = uVar6 + 0x27;
            uVar11 = (uint)((ulong)uVar7 + 4);
            if ((uVar12 <= uVar11) &&
               (uVar7 = Curl_read16_le((uchar *)((long)&pcVar5[2].data + (ulong)uVar6 + 5)),
               uVar11 < uVar12 + uVar7)) {
              return CURLE_READ_ERROR;
            }
          }
          *msg = pcVar5;
        }
      }
      CVar9 = CURLE_OK;
    }
  }
  return CVar9;
}

Assistant:

static CURLcode smb_send_and_recv(struct connectdata *conn, void **msg)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    size_t nread = smbc->upload_size > conn->data->set.upload_buffer_size ?
      conn->data->set.upload_buffer_size :
      smbc->upload_size;
    conn->data->req.upload_fromhere = conn->data->state.ulbuf;
    result = Curl_fillreadbuffer(conn, nread, &nread);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(conn);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(conn, msg);
}